

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

ptr<Expression> __thiscall Parser::unary(Parser *this)

{
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  Parser *in_RSI;
  ptr<Expression> pVar3;
  shared_ptr<Expression> local_80;
  undefined1 local_6a;
  byte local_69;
  undefined1 local_68 [7];
  bool isNew;
  shared_ptr<Expression> local_58 [2];
  undefined1 local_38 [40];
  Parser *this_local;
  ptr<Expression> *expr;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  this_local = this;
  bVar1 = match(in_RSI,Neg);
  if (bVar1) {
    consume(in_RSI);
    unary((Parser *)local_38);
    make<Negation,std::shared_ptr<Expression>>((shared_ptr<Expression> *)(local_38 + 0x10));
    std::shared_ptr<Expression>::shared_ptr<Negation,void>
              ((shared_ptr<Expression> *)this,(shared_ptr<Negation> *)(local_38 + 0x10));
    std::shared_ptr<Negation>::~shared_ptr((shared_ptr<Negation> *)(local_38 + 0x10));
    std::shared_ptr<Expression>::~shared_ptr((shared_ptr<Expression> *)local_38);
    _Var2._M_pi = extraout_RDX;
  }
  else {
    bVar1 = match(in_RSI,Minus);
    if (bVar1) {
      consume(in_RSI);
      unary((Parser *)local_68);
      make<Negative,std::shared_ptr<Expression>>(local_58);
      std::shared_ptr<Expression>::shared_ptr<Negative,void>
                ((shared_ptr<Expression> *)this,(shared_ptr<Negative> *)local_58);
      std::shared_ptr<Negative>::~shared_ptr((shared_ptr<Negative> *)local_58);
      std::shared_ptr<Expression>::~shared_ptr((shared_ptr<Expression> *)local_68);
      _Var2._M_pi = extraout_RDX_00;
    }
    else {
      local_69 = 0;
      bVar1 = match(in_RSI,New);
      if (bVar1) {
        consume(in_RSI);
        local_69 = 1;
      }
      local_6a = 0;
      pVar3 = primary(this);
      _Var2 = pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if ((local_69 & 1) != 0) {
        make<New,std::shared_ptr<Expression>&>(&local_80);
        std::shared_ptr<Expression>::operator=
                  ((shared_ptr<Expression> *)this,(shared_ptr<New> *)&local_80);
        std::shared_ptr<New>::~shared_ptr((shared_ptr<New> *)&local_80);
        _Var2._M_pi = extraout_RDX_01;
      }
    }
  }
  pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Expression>)pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Expression> Parser::unary() {
    if(match(TokenType::Neg)) {
        consume();
        return make<Negation>(unary());
    }

    if(match(TokenType::Minus)) {
        consume();
        return make<Negative>(unary());
    }

    bool isNew = false;
    if(match(TokenType::New)) {
        consume();
        isNew = true;
    }

    ptr<Expression> expr = primary();

    if(isNew) {
        expr = make<New>(expr);
    }

    return expr;
}